

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint16_t *puVar4;
  uchar *puVar5;
  short sVar6;
  uint16_t uVar7;
  uint uVar8;
  ushort *puVar9;
  byte bVar10;
  htree_t *local_118;
  htree_t *ht;
  wchar_t extlen;
  uint16_t bit;
  wchar_t cnt;
  wchar_t len;
  uint16_t *p_1;
  uint16_t *p;
  wchar_t htbl_max;
  wchar_t ebits;
  wchar_t len_avail;
  wchar_t diffbits;
  wchar_t w;
  wchar_t tbl_size;
  wchar_t ptn;
  wchar_t maxbits;
  wchar_t i;
  wchar_t weight [17];
  wchar_t awStack_78 [2];
  wchar_t bitptn [17];
  uchar *bitlen;
  uint16_t *tbl;
  huffman_conflict *hf_local;
  
  tbl_size = L'\0';
  w = L'\0';
  len_avail = L'耀';
  for (ptn = L'\x01'; ptn < L'\x11'; ptn = ptn + L'\x01') {
    awStack_78[ptn] = w;
    (&maxbits)[ptn] = len_avail;
    if (hf->freq[ptn] != L'\0') {
      w = hf->freq[ptn] * len_avail + w;
      tbl_size = ptn;
    }
    len_avail = len_avail >> 1;
  }
  if ((w == L'𐀀') && (tbl_size <= hf->tbl_bits)) {
    hf->max_bits = tbl_size;
    if (tbl_size < L'\x10') {
      bVar10 = 0x10 - (char)tbl_size;
      for (ptn = L'\x01'; ptn <= tbl_size; ptn = ptn + L'\x01') {
        awStack_78[ptn] = awStack_78[ptn] >> (bVar10 & 0x1f);
        (&maxbits)[ptn] = (&maxbits)[ptn] >> (bVar10 & 0x1f);
      }
    }
    if (tbl_size < L'\v') {
      ebits = L'\0';
    }
    else {
      ebits = tbl_size + L'\xfffffff6';
      for (ptn = L'\x01'; ptn < L'\v'; ptn = ptn + L'\x01') {
        awStack_78[ptn] = awStack_78[ptn] >> ((byte)ebits & 0x1f);
        (&maxbits)[ptn] = (&maxbits)[ptn] >> ((byte)ebits & 0x1f);
      }
      p_1 = hf->tbl + (bitptn[8] + weight[8] * hf->freq[10]);
      while (p_1 < hf->tbl + 0x400) {
        *p_1 = 0;
        p_1 = p_1 + 1;
      }
    }
    hf->shift_bits = ebits;
    puVar4 = hf->tbl;
    puVar5 = hf->bitlen;
    wVar1 = hf->len_avail;
    hf->tree_used = L'\0';
    for (ptn = L'\0'; ptn < wVar1; ptn = ptn + L'\x01') {
      if (puVar5[ptn] != '\0') {
        uVar8 = (uint)puVar5[ptn];
        wVar2 = awStack_78[(int)uVar8];
        extlen = (&maxbits)[(int)uVar8];
        uVar7 = (uint16_t)ptn;
        if (uVar8 < 0xb) {
          awStack_78[(int)uVar8] = wVar2 + extlen;
          if (L'Ѐ' < wVar2 + extlen) {
            return L'\0';
          }
          while (extlen = extlen + L'\xffffffff', L'\xffffffff' < extlen) {
            puVar4[(long)wVar2 + (long)extlen] = uVar7;
          }
        }
        else {
          awStack_78[(int)uVar8] = wVar2 + extlen;
          ht._6_2_ = (ushort)(1 << ((byte)ebits - 1 & 0x1f));
          ht._0_4_ = uVar8 - 10;
          puVar9 = puVar4 + (wVar2 >> ((byte)ebits & 0x1f));
          sVar6 = (short)wVar1;
          if (*puVar9 == 0) {
            *puVar9 = sVar6 + (short)hf->tree_used;
            wVar3 = hf->tree_used;
            hf->tree_used = wVar3 + L'\x01';
            local_118 = hf->tree + wVar3;
            if (hf->tree_avail < hf->tree_used) {
              return L'\0';
            }
            local_118->left = 0;
            local_118->right = 0;
          }
          else {
            if (((int)(uint)*puVar9 < wVar1) || (wVar1 + hf->tree_used <= (int)(uint)*puVar9)) {
              return L'\0';
            }
            local_118 = hf->tree + ((uint)*puVar9 - wVar1);
          }
          while (ht._0_4_ = (int)ht + -1, 0 < (int)ht) {
            if ((wVar2 & (uint)ht._6_2_) == 0) {
              if ((int)(uint)local_118->right < wVar1) {
                local_118->right = sVar6 + (short)hf->tree_used;
                wVar3 = hf->tree_used;
                hf->tree_used = wVar3 + L'\x01';
                local_118 = hf->tree + wVar3;
                if (hf->tree_avail < hf->tree_used) {
                  return L'\0';
                }
                local_118->left = 0;
                local_118->right = 0;
              }
              else {
                local_118 = hf->tree + ((uint)local_118->right - wVar1);
              }
            }
            else if ((int)(uint)local_118->left < wVar1) {
              local_118->left = sVar6 + (short)hf->tree_used;
              wVar3 = hf->tree_used;
              hf->tree_used = wVar3 + L'\x01';
              local_118 = hf->tree + wVar3;
              if (hf->tree_avail < hf->tree_used) {
                return L'\0';
              }
              local_118->left = 0;
              local_118->right = 0;
            }
            else {
              local_118 = hf->tree + ((uint)local_118->left - wVar1);
            }
            ht._6_2_ = (ushort)((int)(uint)ht._6_2_ >> 1);
          }
          if ((wVar2 & (uint)ht._6_2_) == 0) {
            if (local_118->right != 0) {
              return L'\0';
            }
            local_118->right = uVar7;
          }
          else {
            if (local_118->left != 0) {
              return L'\0';
            }
            local_118->left = uVar7;
          }
        }
      }
    }
    hf_local._4_4_ = L'\x01';
  }
  else {
    hf_local._4_4_ = L'\0';
  }
  return hf_local._4_4_;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		int htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			while (--cnt >= 0)
				p[cnt] = (uint16_t)i;
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}